

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Bool poolGrow(STRING_POOL *pool)

{
  block *pbVar1;
  XML_Char *pXVar2;
  XML_Char *pXVar3;
  int iVar4;
  size_t sVar5;
  BLOCK *pBVar6;
  size_t bytesToAllocate_1;
  int blockSize_1;
  BLOCK *tem_1;
  ptrdiff_t offsetInsideBlock;
  size_t bytesToAllocate;
  int blockSize;
  BLOCK *temp;
  BLOCK *tem;
  STRING_POOL *pool_local;
  
  if (pool->freeBlocks != (BLOCK *)0x0) {
    if (pool->start == (XML_Char *)0x0) {
      pool->blocks = pool->freeBlocks;
      pool->freeBlocks = pool->freeBlocks->next;
      pool->blocks->next = (block *)0x0;
      pool->start = pool->blocks->s;
      pool->end = pool->start + pool->blocks->size;
      pool->ptr = pool->start;
      return '\x01';
    }
    if ((long)pool->end - (long)pool->start < (long)pool->freeBlocks->size) {
      pbVar1 = pool->freeBlocks->next;
      pool->freeBlocks->next = pool->blocks;
      pool->blocks = pool->freeBlocks;
      pool->freeBlocks = pbVar1;
      memcpy(pool->blocks->s,pool->start,(long)pool->end - (long)pool->start);
      pool->ptr = pool->ptr + (long)pool->blocks + (0xc - (long)pool->start);
      pool->start = pool->blocks->s;
      pool->end = pool->start + pool->blocks->size;
      return '\x01';
    }
  }
  if ((pool->blocks == (BLOCK *)0x0) || (pool->start != pool->blocks->s)) {
    iVar4 = (int)pool->end - (int)pool->start;
    if (iVar4 < 0) {
      return '\0';
    }
    if (iVar4 < 0x400) {
      bytesToAllocate_1._4_4_ = 0x400;
    }
    else {
      if (iVar4 * 2 < 0) {
        return '\0';
      }
      bytesToAllocate_1._4_4_ = iVar4 * 2;
    }
    sVar5 = poolBytesToAllocateFor(bytesToAllocate_1._4_4_);
    if (sVar5 == 0) {
      return '\0';
    }
    pBVar6 = (BLOCK *)(*pool->mem->malloc_fcn)(sVar5);
    if (pBVar6 == (BLOCK *)0x0) {
      return '\0';
    }
    pBVar6->size = bytesToAllocate_1._4_4_;
    pBVar6->next = pool->blocks;
    pool->blocks = pBVar6;
    if (pool->ptr != pool->start) {
      memcpy(pBVar6->s,pool->start,(long)pool->ptr - (long)pool->start);
    }
    pool->ptr = pool->ptr + (0xc - (long)pool->start) + (long)(pBVar6->s + -0xc);
    pool->start = pBVar6->s;
    pool->end = pBVar6->s + bytesToAllocate_1._4_4_;
  }
  else {
    iVar4 = ((int)pool->end - (int)pool->start) * 2;
    pXVar2 = pool->ptr;
    pXVar3 = pool->start;
    if (iVar4 < 0) {
      return '\0';
    }
    sVar5 = poolBytesToAllocateFor(iVar4);
    if (sVar5 == 0) {
      return '\0';
    }
    pBVar6 = (BLOCK *)(*pool->mem->realloc_fcn)(pool->blocks,sVar5 & 0xffffffff);
    if (pBVar6 == (BLOCK *)0x0) {
      return '\0';
    }
    pool->blocks = pBVar6;
    pool->blocks->size = iVar4;
    pool->ptr = pXVar2 + (long)pool->blocks + (0xc - (long)pXVar3);
    pool->start = pool->blocks->s;
    pool->end = pool->start + iVar4;
  }
  return '\x01';
}

Assistant:

static XML_Bool FASTCALL
poolGrow(STRING_POOL *pool)
{
  if (pool->freeBlocks) {
    if (pool->start == 0) {
      pool->blocks = pool->freeBlocks;
      pool->freeBlocks = pool->freeBlocks->next;
      pool->blocks->next = NULL;
      pool->start = pool->blocks->s;
      pool->end = pool->start + pool->blocks->size;
      pool->ptr = pool->start;
      return XML_TRUE;
    }
    if (pool->end - pool->start < pool->freeBlocks->size) {
      BLOCK *tem = pool->freeBlocks->next;
      pool->freeBlocks->next = pool->blocks;
      pool->blocks = pool->freeBlocks;
      pool->freeBlocks = tem;
      memcpy(pool->blocks->s, pool->start,
             (pool->end - pool->start) * sizeof(XML_Char));
      pool->ptr = pool->blocks->s + (pool->ptr - pool->start);
      pool->start = pool->blocks->s;
      pool->end = pool->start + pool->blocks->size;
      return XML_TRUE;
    }
  }
  if (pool->blocks && pool->start == pool->blocks->s) {
    BLOCK *temp;
    int blockSize = (int)((unsigned)(pool->end - pool->start)*2U);
    size_t bytesToAllocate;

    /* NOTE: Needs to be calculated prior to calling `realloc`
             to avoid dangling pointers: */
    const ptrdiff_t offsetInsideBlock = pool->ptr - pool->start;

    if (blockSize < 0) {
      /* This condition traps a situation where either more than
       * INT_MAX/2 bytes have already been allocated.  This isn't
       * readily testable, since it is unlikely that an average
       * machine will have that much memory, so we exclude it from the
       * coverage statistics.
       */
      return XML_FALSE; /* LCOV_EXCL_LINE */
    }

    bytesToAllocate = poolBytesToAllocateFor(blockSize);
    if (bytesToAllocate == 0)
      return XML_FALSE;

    temp = (BLOCK *)
      pool->mem->realloc_fcn(pool->blocks, (unsigned)bytesToAllocate);
    if (temp == NULL)
      return XML_FALSE;
    pool->blocks = temp;
    pool->blocks->size = blockSize;
    pool->ptr = pool->blocks->s + offsetInsideBlock;
    pool->start = pool->blocks->s;
    pool->end = pool->start + blockSize;
  }
  else {
    BLOCK *tem;
    int blockSize = (int)(pool->end - pool->start);
    size_t bytesToAllocate;

    if (blockSize < 0) {
      /* This condition traps a situation where either more than
       * INT_MAX bytes have already been allocated (which is prevented
       * by various pieces of program logic, not least this one, never
       * mind the unlikelihood of actually having that much memory) or
       * the pool control fields have been corrupted (which could
       * conceivably happen in an extremely buggy user handler
       * function).  Either way it isn't readily testable, so we
       * exclude it from the coverage statistics.
       */
      return XML_FALSE;  /* LCOV_EXCL_LINE */
    }

    if (blockSize < INIT_BLOCK_SIZE)
      blockSize = INIT_BLOCK_SIZE;
    else {
      /* Detect overflow, avoiding _signed_ overflow undefined behavior */
      if ((int)((unsigned)blockSize * 2U) < 0) {
        return XML_FALSE;
      }
      blockSize *= 2;
    }

    bytesToAllocate = poolBytesToAllocateFor(blockSize);
    if (bytesToAllocate == 0)
      return XML_FALSE;

    tem = (BLOCK *)pool->mem->malloc_fcn(bytesToAllocate);
    if (!tem)
      return XML_FALSE;
    tem->size = blockSize;
    tem->next = pool->blocks;
    pool->blocks = tem;
    if (pool->ptr != pool->start)
      memcpy(tem->s, pool->start,
             (pool->ptr - pool->start) * sizeof(XML_Char));
    pool->ptr = tem->s + (pool->ptr - pool->start);
    pool->start = tem->s;
    pool->end = tem->s + blockSize;
  }
  return XML_TRUE;
}